

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_unlink_files(uv_timer_t *handle)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == (uv_timer_t *)0x0) {
    for (iVar2 = 0; iVar2 != 0x10; iVar2 = iVar2 + 1) {
      fs_event_get_filename(iVar2);
      remove(fs_event_filename);
    }
    return;
  }
  eval_a = (int64_t)fs_event_removed;
  eval_b = 0x10;
  if (eval_a < 0x10) {
    fs_event_get_filename(fs_event_removed);
    iVar2 = remove(fs_event_filename);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a == 0) {
      iVar2 = fs_event_removed + 1;
      bVar1 = fs_event_removed < 0xf;
      fs_event_removed = iVar2;
      if (bVar1) {
        iVar2 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        eval_a = (int64_t)iVar2;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar5 = "==";
          pcVar6 = "0";
          pcVar4 = "uv_timer_start(&timer, fs_event_unlink_files, 1, 0)";
          uVar3 = 0xbb;
          goto LAB_0011b927;
        }
      }
      return;
    }
    pcVar5 = "==";
    pcVar6 = "0";
    pcVar4 = "remove(fs_event_get_filename(fs_event_removed))";
    uVar3 = 0xb6;
  }
  else {
    pcVar5 = "<";
    pcVar6 = "fs_event_file_count";
    pcVar4 = "fs_event_removed";
    uVar3 = 0xb3;
  }
LAB_0011b927:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

static void fs_event_unlink_files(uv_timer_t* handle) {
  int r;
  int i;

  /* NOTE: handle might be NULL if invoked not as timer callback */
  if (handle == NULL) {
    /* Unlink all files */
    for (i = 0; i < 16; i++) {
      r = remove(fs_event_get_filename(i));
      if (handle != NULL)
        ASSERT_OK(r);
    }
  } else {
    /* Make sure we're not attempting to remove files we do not intend */
    ASSERT_LT(fs_event_removed, fs_event_file_count);

    /* Remove the file */
    ASSERT_OK(remove(fs_event_get_filename(fs_event_removed)));

    if (++fs_event_removed < fs_event_file_count) {
      /* Remove another file on a different event loop tick.  We do it this way
       * to avoid fs events coalescing into one fs event. */
      ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
    }
  }
}